

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O1

void __thiscall
rapidjson::internal::DiyFp::NormalizedBoundaries(DiyFp *this,DiyFp *minus,DiyFp *plus)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  uVar2 = this->f;
  uVar6 = uVar2 * 2 + 1;
  iVar1 = this->e;
  iVar4 = iVar1 + -1;
  if ((uVar2 >> 0x34 & 1) == 0) {
    lVar5 = 0x3f;
    if ((uVar6 & 0x1fffffffffffff) != 0) {
      for (; (uVar6 & 0x1fffffffffffff) >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    uVar6 = uVar6 << (~(byte)lVar5 + 0x36 & 0x3f);
    iVar4 = (iVar1 - ((uint)lVar5 ^ 0x3f)) + 9;
  }
  iVar4 = iVar4 + -10;
  iVar3 = iVar1 + -1;
  if (uVar2 == 0x10000000000000) {
    iVar3 = iVar1 + -2;
  }
  lVar5 = 0x3fffffffffffff;
  if (uVar2 != 0x10000000000000) {
    lVar5 = uVar2 * 2 + -1;
  }
  plus->f = uVar6 << 10;
  plus->e = iVar4;
  minus->f = lVar5 << ((char)iVar3 - (char)iVar4 & 0x3fU);
  minus->e = iVar4;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* minus, DiyFp* plus) const {
        DiyFp pl = DiyFp((f << 1) + 1, e - 1).NormalizeBoundary();
        DiyFp mi = (f == kDpHiddenBit) ? DiyFp((f << 2) - 1, e - 2) : DiyFp((f << 1) - 1, e - 1);
        mi.f <<= mi.e - pl.e;
        mi.e = pl.e;
        *plus = pl;
        *minus = mi;
    }